

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

void __thiscall
ParamListStandardOut::restoreXml
          (ParamListStandardOut *this,Element *el,AddrSpaceManager *manage,
          vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist,bool normalstack)

{
  list<ParamEntry,_std::allocator<ParamEntry>_> *entry;
  _List_node_base *p_Var1;
  
  ParamListStandard::restoreXml(&this->super_ParamListStandard,el,manage,effectlist,normalstack);
  entry = &(this->super_ParamListStandard).entry;
  for (p_Var1 = (this->super_ParamListStandard).entry.
                super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var1 != (_List_node_base *)entry;
      p_Var1 = p_Var1->_M_next) {
    ParamEntry::extraChecks((ParamEntry *)(p_Var1 + 1),entry);
  }
  return;
}

Assistant:

void ParamListStandardOut::restoreXml(const Element *el,const AddrSpaceManager *manage,vector<EffectRecord> &effectlist,bool normalstack)

{
  ParamListStandard::restoreXml(el,manage,effectlist,normalstack);
  // Check for double precision entries
  list<ParamEntry>::iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter)
    (*iter).extraChecks(entry);
}